

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void __thiscall re2::Regexp::Regexp(Regexp *this,RegexpOp op,ParseFlags parse_flags)

{
  this->op_ = (uint8)op;
  this->simple_ = '\0';
  this->parse_flags_ = (uint16)parse_flags;
  this->ref_ = 1;
  *(undefined8 *)&this->nsub_ = 0;
  *(undefined8 *)((long)&this->field_5 + 6) = 0;
  *(undefined8 *)((long)&this->down_ + 6) = 0;
  *(undefined8 *)((long)&(this->field_7).field_3.cc_ + 6) = 0;
  *(undefined2 *)((long)&this->field_7 + 0xe) = 0;
  return;
}

Assistant:

Regexp::Regexp(RegexpOp op, ParseFlags parse_flags)
  : op_(static_cast<uint8>(op)),
    simple_(false),
    parse_flags_(static_cast<uint16>(parse_flags)),
    ref_(1),
    nsub_(0),
    down_(NULL) {
  subone_ = NULL;
  memset(the_union_, 0, sizeof the_union_);
}